

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O2

int xmlParse3986PathAbsolute(xmlURIPtr uri,char **str)

{
  xmlChar *pxVar1;
  int iVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlChar *local_30;
  
  pxVar4 = (xmlChar *)*str;
  if (*pxVar4 == '/') {
    local_30 = pxVar4 + 1;
    iVar2 = xmlParse3986Segment((char **)&local_30,'\0',0);
    if (iVar2 == 0) {
      iVar2 = 1;
      do {
        if (*local_30 != '/') goto LAB_00188813;
        local_30 = local_30 + 1;
        iVar3 = xmlParse3986Segment((char **)&local_30,'\0',1);
      } while (iVar3 == 0);
    }
    else {
LAB_00188813:
      if (uri != (xmlURIPtr)0x0) {
        if (uri->path != (char *)0x0) {
          (*xmlFree)(uri->path);
          pxVar4 = (xmlChar *)*str;
        }
        pxVar1 = local_30;
        if (local_30 == pxVar4) {
          uri->path = (char *)0x0;
          local_30 = pxVar1;
        }
        else {
          iVar2 = (int)local_30 - (int)pxVar4;
          if ((uri->cleanup & 2) == 0) {
            pxVar4 = (xmlChar *)xmlURIUnescapeString((char *)pxVar4,iVar2,(char *)0x0);
          }
          else {
            pxVar4 = xmlStrndup(pxVar4,iVar2);
          }
          uri->path = (char *)pxVar4;
          local_30 = pxVar1;
        }
      }
      *str = (char *)local_30;
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
xmlParse3986PathAbsolute(xmlURIPtr uri, const char **str)
{
    const char *cur;
    int ret;

    cur = *str;

    if (*cur != '/')
        return(1);
    cur++;
    ret = xmlParse3986Segment(&cur, 0, 0);
    if (ret == 0) {
	while (*cur == '/') {
	    cur++;
	    ret = xmlParse3986Segment(&cur, 0, 1);
	    if (ret != 0) return(ret);
	}
    }
    if (uri != NULL) {
	if (uri->path != NULL) xmlFree(uri->path);
        if (cur != *str) {
            if (uri->cleanup & 2)
                uri->path = STRNDUP(*str, cur - *str);
            else
                uri->path = xmlURIUnescapeString(*str, cur - *str, NULL);
        } else {
            uri->path = NULL;
        }
    }
    *str = cur;
    return (0);
}